

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_b296a::TraverseInfo::TraverseInfo(TraverseInfo *this,Ref node)

{
  bool bVar1;
  Value *pVVar2;
  size_t sVar3;
  undefined8 *puVar4;
  Assign *this_00;
  AssignName *this_01;
  Ref *pRVar5;
  AssignName *assign_1;
  Assign *assign;
  ulong local_20;
  size_t i;
  TraverseInfo *this_local;
  Ref node_local;
  
  (this->node).inst = node.inst;
  this->scanned = false;
  this_local = (TraverseInfo *)node.inst;
  std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>::vector(&this->children);
  pVVar2 = cashew::Ref::get((Ref *)&this_local);
  if (pVVar2 == (Value *)0x0) {
    __assert_fail("node.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2js.cpp"
                  ,0x4c,"(anonymous namespace)::TraverseInfo::TraverseInfo(Ref)");
  }
  pVVar2 = cashew::Ref::operator->((Ref *)&this_local);
  bVar1 = cashew::Value::isArray(pVVar2);
  if (bVar1) {
    local_20 = 0;
    while( true ) {
      pVVar2 = cashew::Ref::operator->((Ref *)&this_local);
      sVar3 = cashew::Value::size(pVVar2);
      if (sVar3 <= local_20) break;
      puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
      maybeAdd(this,(Value *)*puVar4);
      local_20 = local_20 + 1;
    }
  }
  else {
    pVVar2 = cashew::Ref::operator->((Ref *)&this_local);
    bVar1 = cashew::Value::isAssign(pVVar2);
    if (bVar1) {
      cashew::Ref::operator->((Ref *)&this_local);
      this_00 = (Assign *)cashew::Value::asAssign();
      pRVar5 = cashew::Assign::target(this_00);
      maybeAdd(this,pRVar5->inst);
      pRVar5 = cashew::Assign::value(this_00);
      maybeAdd(this,pRVar5->inst);
    }
    else {
      pVVar2 = cashew::Ref::operator->((Ref *)&this_local);
      bVar1 = cashew::Value::isAssignName(pVVar2);
      if (bVar1) {
        cashew::Ref::operator->((Ref *)&this_local);
        this_01 = (AssignName *)cashew::Value::asAssignName();
        pRVar5 = cashew::AssignName::value(this_01);
        maybeAdd(this,pRVar5->inst);
      }
    }
  }
  return;
}

Assistant:

TraverseInfo(Ref node) : node(node) {
    assert(node.get());
    if (node->isArray()) {
      for (size_t i = 0; i < node->size(); i++) {
        maybeAdd(node[i]);
      }
    } else if (node->isAssign()) {
      auto assign = node->asAssign();
      maybeAdd(assign->target());
      maybeAdd(assign->value());
    } else if (node->isAssignName()) {
      auto assign = node->asAssignName();
      maybeAdd(assign->value());
    } else {
      // no children
    }
  }